

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply.hpp
# Opt level: O0

anon_class_40_5_d6c92a71_conflict * __thiscall
qclab::qgates::lambda_QGate1<std::complex<float>>
          (anon_class_40_5_d6c92a71_conflict *__return_storage_ptr__,qgates *this,Op op,
          SquareMatrix<std::complex<float>_> *mat1,complex<float> *vector)

{
  _ComplexT_conflict _Var1;
  _ComplexT_conflict _Var2;
  int64_t iVar3;
  complex<float> *pcVar4;
  complex<float> *pcVar5;
  undefined7 in_register_00000011;
  SquareMatrix<std::complex<float>_> *this_00;
  SquareMatrix<std::complex<float>_> *local_68;
  anon_class_40_5_d6c92a71_conflict f;
  complex<float> m22;
  complex<float> m21;
  complex<float> m12;
  complex<float> m11;
  complex<float> *vector_local;
  SquareMatrix<std::complex<float>_> *mat1_local;
  Op op_local;
  
  this_00 = (SquareMatrix<std::complex<float>_> *)CONCAT71(in_register_00000011,op);
  iVar3 = dense::SquareMatrix<std::complex<float>_>::size(this_00);
  if (iVar3 == 2) {
    dense::operateInPlace<qclab::dense::SquareMatrix<std::complex<float>>>((Op)this,this_00);
    pcVar4 = dense::SquareMatrix<std::complex<float>_>::operator()(this_00,0,0);
    pcVar4 = (complex<float> *)pcVar4->_M_value;
    pcVar5 = dense::SquareMatrix<std::complex<float>_>::operator()(this_00,0,1);
    _Var1 = pcVar5->_M_value;
    pcVar5 = dense::SquareMatrix<std::complex<float>_>::operator()(this_00,1,0);
    _Var2 = pcVar5->_M_value;
    pcVar5 = dense::SquareMatrix<std::complex<float>_>::operator()(this_00,1,1);
    f.m21._M_value = pcVar5->_M_value;
    local_68 = mat1;
    f.vector = pcVar4;
    f.m11._M_value = _Var1;
    f.m12._M_value = _Var2;
    f.m22._M_value = f.m21._M_value;
    memcpy(__return_storage_ptr__,&local_68,0x28);
    return __return_storage_ptr__;
  }
  __assert_fail("mat1.size() == 2",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/apply.hpp"
                ,0xd,
                "auto qclab::qgates::lambda_QGate1(Op, qclab::dense::SquareMatrix<T>, T *) [T = std::complex<float>]"
               );
}

Assistant:

auto lambda_QGate1( Op op , qclab::dense::SquareMatrix< T > mat1 ,
                      T* vector ) {
    assert( mat1.size() == 2 ) ;
    // operation
    qclab::dense::operateInPlace( op , mat1 ) ;
    const T m11 = mat1( 0 , 0 ) ; const T m12 = mat1( 0 , 1 ) ;
    const T m21 = mat1( 1 , 0 ) ; const T m22 = mat1( 1 , 1 ) ;
    // matvec
    auto f = [=] ( const uint64_t a , const uint64_t b ) {
      const T x1 = vector[a] ;
      const T x2 = vector[b] ;
      vector[a] = m11 * x1 + m12 * x2 ;
      vector[b] = m21 * x1 + m22 * x2 ;
    } ;
    return f ;
  }